

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.c
# Opt level: O0

int mixed_make_segment_delay(float time,uint32_t samplerate,mixed_segment *segment)

{
  int iVar1;
  void *pvVar2;
  double dVar3;
  delay_segment_data *data;
  mixed_segment *segment_local;
  uint32_t samplerate_local;
  float time_local;
  
  pvVar2 = (*mixed_calloc)(1,0x38);
  if (pvVar2 == (void *)0x0) {
    mixed_err(1);
    samplerate_local = 0;
  }
  else {
    dVar3 = ceil((double)(time * (float)samplerate));
    iVar1 = mixed_make_buffer((uint32_t)(long)dVar3,(mixed_buffer *)((long)pvVar2 + 0x10));
    if (iVar1 == 0) {
      (*mixed_free)(pvVar2);
      samplerate_local = 0;
    }
    else {
      *(float *)((long)pvVar2 + 0x30) = time;
      *(uint32_t *)((long)pvVar2 + 0x34) = samplerate;
      segment->free = delay_segment_free;
      segment->start = delay_segment_start;
      segment->mix = delay_segment_mix;
      segment->set_in = delay_segment_set_in;
      segment->set_out = delay_segment_set_out;
      segment->info = delay_segment_info;
      segment->get = delay_segment_get;
      segment->set = delay_segment_set;
      segment->data = pvVar2;
      samplerate_local = 1;
    }
  }
  return samplerate_local;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_delay(float time, uint32_t samplerate, struct mixed_segment *segment){
  struct delay_segment_data *data = mixed_calloc(1, sizeof(struct delay_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  if(!mixed_make_buffer(ceil(time * samplerate), &data->buffer)){
    mixed_free(data);
    return 0;
  }

  data->time = time;
  data->samplerate = samplerate;
  
  segment->free = delay_segment_free;
  segment->start = delay_segment_start;
  segment->mix = delay_segment_mix;
  segment->set_in = delay_segment_set_in;
  segment->set_out = delay_segment_set_out;
  segment->info = delay_segment_info;
  segment->get = delay_segment_get;
  segment->set = delay_segment_set;
  segment->data = data;
  return 1;
}